

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

type __thiscall
nonstd::optional_lite::
optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::operator=(optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *this,optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *other)

{
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&this->contained + 8));
      this->has_value_ = false;
      return this;
    }
  }
  else {
    if (other->has_value_ == true) {
      optional<std::pair<tinyusdz::ListEditQual,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
      ::
      initialize<std::pair<tinyusdz::ListEditQual,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((optional<std::pair<tinyusdz::ListEditQual,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)this,(pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&other->contained);
      return this;
    }
    if (this->has_value_ == false) {
      return this;
    }
  }
  if (other->has_value_ == true) {
    *(undefined4 *)&this->contained = *(undefined4 *)&other->contained;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&this->contained + 8),(undefined1 *)((long)&other->contained + 8));
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }